

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::_Mem(_Mem *this)

{
  ModelBase *this_00;
  _Mem *this_local;
  
  r_code::Mem::Mem(&this->super_Mem);
  *(undefined ***)this = &PTR___cxa_pure_virtual_002ec728;
  JobQueue<r_exec::_ReductionJob>::JobQueue(&this->m_reductionJobQueue);
  JobQueue<r_exec::TimeJob>::JobQueue(&this->m_timeJobQueue);
  std::mutex::mutex(&this->m_timeJobMutex);
  std::mutex::mutex(&this->m_reductionJobMutex);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->m_coreThreads);
  std::condition_variable::condition_variable(&this->m_coresRunning);
  std::mutex::mutex(&this->m_coreCountMutex);
  this->state = NOT_STARTED;
  std::mutex::mutex(&this->m_stateMutex);
  r_code::list<core::P<r_code::Code>_>::list(&this->objects);
  core::P<r_exec::Group>::P(&this->_root);
  std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::vector(&this->initial_groups);
  this->deleted = false;
  this->metadata = (Metadata *)0x0;
  this_00 = (ModelBase *)operator_new(0xa0);
  ModelBase::ModelBase(this_00);
  r_code::list<core::P<r_code::Code>_>::reserve(&this->objects,0x400);
  return;
}

Assistant:

_Mem::_Mem(): r_code::Mem(), state(NOT_STARTED), deleted(false)
{
    new ModelBase();
    objects.reserve(1024);
}